

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeGraph.cpp
# Opt level: O0

void __thiscall Assimp::OptimizeGraphProcess::Execute(OptimizeGraphProcess *this,aiScene *pScene)

{
  aiString *paVar1;
  bool bVar2;
  Logger *pLVar3;
  reference __x;
  reference pvVar4;
  aiNode *paVar5;
  aiNode **ppaVar6;
  size_type sVar7;
  DeadlyImportError *this_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar8;
  basic_formatter *this_01;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  string local_650;
  undefined1 local_62a;
  allocator local_629;
  string local_628;
  undefined1 local_608 [8];
  list<aiNode_*,_std::allocator<aiNode_*>_> nodes;
  aiString prev;
  allocator local_1d1;
  value_type local_1d0;
  undefined1 local_1aa;
  allocator local_1a9;
  string local_1a8;
  aiNode *local_188;
  aiNode *dummy_root;
  undefined1 local_178;
  allocator local_169;
  value_type local_168;
  aiLight *local_148;
  aiLight *lgh;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_138;
  uint i_3;
  undefined1 local_130;
  allocator local_121;
  value_type local_120;
  aiCamera *local_100;
  aiCamera *cam;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_f0;
  uint i_2;
  undefined1 local_e8;
  allocator local_d9;
  value_type local_d8;
  aiBone *local_b8;
  aiBone *bone;
  uint a_1;
  uint i_1;
  undefined1 local_a0;
  allocator local_81;
  value_type local_80;
  aiNodeAnim *local_60;
  aiNodeAnim *anim;
  uint a;
  uint i;
  undefined1 local_48;
  iterator local_40;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  iterator local_30;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  const_iterator it;
  aiScene *pScene_local;
  OptimizeGraphProcess *this_local;
  
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"OptimizeGraphProcess begin");
  this->count_merged = 0;
  this->nodes_out = 0;
  this->nodes_in = 0;
  this->mScene = pScene;
  it._M_node._4_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->meshes,(ulong)pScene->mNumMeshes,(value_type_conflict *)((long)&it._M_node + 4))
  ;
  FindInstancedMeshes(this,pScene->mRootNode);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->locked);
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->locked_nodes);
  std::
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_List_const_iterator(&local_28,&local_30);
  while( true ) {
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->locked_nodes);
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_List_const_iterator(&local_38,&local_40);
    bVar2 = std::operator!=(&local_28,&local_38);
    if (!bVar2) break;
    __x = std::
          _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(&local_28);
    pVar9 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->locked,__x);
    _a = pVar9.first._M_node;
    local_48 = pVar9.second;
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_28);
  }
  for (anim._4_4_ = 0; anim._4_4_ < pScene->mNumAnimations; anim._4_4_ = anim._4_4_ + 1) {
    for (anim._0_4_ = 0; (uint)anim < pScene->mAnimations[anim._4_4_]->mNumChannels;
        anim._0_4_ = (uint)anim + 1) {
      local_60 = pScene->mAnimations[anim._4_4_]->mChannels[(uint)anim];
      paVar1 = &local_60->mNodeName;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_80,paVar1->data,&local_81);
      pVar9 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(&this->locked,&local_80);
      _a_1 = pVar9.first._M_node;
      local_a0 = pVar9.second;
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
    }
  }
  for (bone._4_4_ = 0; bone._4_4_ < pScene->mNumMeshes; bone._4_4_ = bone._4_4_ + 1) {
    for (bone._0_4_ = 0; (uint)bone < pScene->mMeshes[bone._4_4_]->mNumBones;
        bone._0_4_ = (uint)bone + 1) {
      local_b8 = pScene->mMeshes[bone._4_4_]->mBones[(uint)bone];
      paVar1 = &local_b8->mName;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d8,paVar1->data,&local_d9);
      pVar9 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(&this->locked,&local_d8);
      _Stack_f0 = pVar9.first._M_node;
      local_e8 = pVar9.second;
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->meshes,(ulong)bone._4_4_);
      *pvVar4 = *pvVar4 + 2;
    }
  }
  for (cam._4_4_ = 0; cam._4_4_ < pScene->mNumCameras; cam._4_4_ = cam._4_4_ + 1) {
    local_100 = pScene->mCameras[cam._4_4_];
    paVar1 = &local_100->mName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_120,paVar1->data,&local_121);
    pVar9 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->locked,&local_120);
    _Stack_138 = pVar9.first._M_node;
    local_130 = pVar9.second;
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
  }
  for (lgh._4_4_ = 0; lgh._4_4_ < pScene->mNumLights; lgh._4_4_ = lgh._4_4_ + 1) {
    local_148 = pScene->mLights[lgh._4_4_];
    paVar1 = &local_148->mName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_168,paVar1->data,&local_169);
    pVar9 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->locked,&local_168);
    dummy_root = (aiNode *)pVar9.first._M_node;
    local_178 = pVar9.second;
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
  }
  paVar5 = (aiNode *)operator_new(0x478);
  local_1aa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a8,"$Reserved_And_Evil",&local_1a9);
  aiNode::aiNode(paVar5,&local_1a8);
  local_1aa = 0;
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  local_188 = paVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,(paVar5->mName).data,&local_1d1);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(&this->locked,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  aiString::aiString((aiString *)
                     ((long)&nodes.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                             _M_node._M_size + 4),&pScene->mRootNode->mName);
  pScene->mRootNode->mParent = local_188;
  local_188->mNumChildren = 1;
  ppaVar6 = (aiNode **)operator_new__(8);
  local_188->mChildren = ppaVar6;
  *local_188->mChildren = pScene->mRootNode;
  std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::list
            ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_608);
  CollectNewChildren(this,local_188,(list<aiNode_*,_std::allocator<aiNode_*>_> *)local_608);
  sVar7 = std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::size
                    ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_608);
  paVar5 = local_188;
  if (sVar7 != 1) {
    __assert_fail("nodes.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/OptimizeGraph.cpp"
                  ,0x131,"virtual void Assimp::OptimizeGraphProcess::Execute(aiScene *)");
  }
  if (local_188->mNumChildren != 0) {
    if (local_188->mNumChildren < 2) {
      pScene->mRootNode = *local_188->mChildren;
      *local_188->mChildren = (aiNode *)0x0;
      if (local_188 != (aiNode *)0x0) {
        aiNode::~aiNode(local_188);
        operator_delete(paVar5);
      }
    }
    else {
      pScene->mRootNode = local_188;
      aiString::operator=(&pScene->mRootNode->mName,
                          (aiString *)
                          ((long)&nodes.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>.
                                  _M_impl._M_node._M_size + 4));
    }
    pScene->mRootNode->mParent = (aiNode *)0x0;
    bVar2 = DefaultLogger::isNullLogger();
    if (!bVar2) {
      if (this->nodes_in == this->nodes_out) {
        pLVar3 = DefaultLogger::get();
        Logger::debug(pLVar3,"OptimizeGraphProcess finished");
      }
      else {
        pLVar3 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[45]>
                  (&local_7c8,(char (*) [45])"OptimizeGraphProcess finished; Input nodes: ");
        pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                           &local_7c8,&this->nodes_in);
        pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_(pbVar8,(char (*) [17])", Output nodes: ");
        this_01 = (basic_formatter *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar8,&this->nodes_out);
        Formatter::basic_formatter::operator_cast_to_string(&local_650,this_01);
        Logger::info(pLVar3,&local_650);
        std::__cxx11::string::~string((string *)&local_650);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_7c8);
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->meshes);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->locked);
    std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::~list
              ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_608);
    return;
  }
  pScene->mRootNode = (aiNode *)0x0;
  local_62a = 1;
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_628,"After optimizing the scene graph, no data remains",&local_629);
  DeadlyImportError::DeadlyImportError(this_00,&local_628);
  local_62a = 0;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void OptimizeGraphProcess::Execute( aiScene* pScene) {
    ASSIMP_LOG_DEBUG("OptimizeGraphProcess begin");
    nodes_in = nodes_out = count_merged = 0;
    mScene = pScene;

    meshes.resize(pScene->mNumMeshes,0);
    FindInstancedMeshes(pScene->mRootNode);

    // build a blacklist of identifiers. If the name of a node matches one of these, we won't touch it
    locked.clear();
    for (std::list<std::string>::const_iterator it = locked_nodes.begin(); it != locked_nodes.end(); ++it) {
#ifdef AI_OG_USE_HASHING
        locked.insert(SuperFastHash((*it).c_str()));
#else
        locked.insert(*it);
#endif
    }

    for (unsigned int i = 0; i < pScene->mNumAnimations; ++i) {
        for (unsigned int a = 0; a < pScene->mAnimations[i]->mNumChannels; ++a) {
            aiNodeAnim* anim = pScene->mAnimations[i]->mChannels[a];
            locked.insert(AI_OG_GETKEY(anim->mNodeName));
        }
    }

    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
        for (unsigned int a = 0; a < pScene->mMeshes[i]->mNumBones; ++a) {

            aiBone* bone = pScene->mMeshes[i]->mBones[a];
            locked.insert(AI_OG_GETKEY(bone->mName));

            // HACK: Meshes referencing bones may not be transformed; we need to look them.
            // The easiest way to do this is to increase their reference counters ...
            meshes[i] += 2;
        }
    }

    for (unsigned int i = 0; i < pScene->mNumCameras; ++i) {
        aiCamera* cam = pScene->mCameras[i];
        locked.insert(AI_OG_GETKEY(cam->mName));
    }

    for (unsigned int i = 0; i < pScene->mNumLights; ++i) {
        aiLight* lgh = pScene->mLights[i];
        locked.insert(AI_OG_GETKEY(lgh->mName));
    }

    // Insert a dummy master node and make it read-only
    aiNode* dummy_root = new aiNode(AI_RESERVED_NODE_NAME);
    locked.insert(AI_OG_GETKEY(dummy_root->mName));

    const aiString prev = pScene->mRootNode->mName;
    pScene->mRootNode->mParent = dummy_root;

    dummy_root->mChildren = new aiNode*[dummy_root->mNumChildren = 1];
    dummy_root->mChildren[0] = pScene->mRootNode;

    // Do our recursive processing of scenegraph nodes. For each node collect
    // a fully new list of children and allow their children to place themselves
    // on the same hierarchy layer as their parents.
    std::list<aiNode*> nodes;
    CollectNewChildren (dummy_root,nodes);

    ai_assert(nodes.size() == 1);

    if (dummy_root->mNumChildren == 0) {
        pScene->mRootNode = NULL;
        throw DeadlyImportError("After optimizing the scene graph, no data remains");
    }

    if (dummy_root->mNumChildren > 1) {
        pScene->mRootNode = dummy_root;

        // Keep the dummy node but assign the name of the old root node to it
        pScene->mRootNode->mName = prev;
    }
    else {

        // Remove the dummy root node again.
        pScene->mRootNode = dummy_root->mChildren[0];

        dummy_root->mChildren[0] = NULL;
        delete dummy_root;
    }

    pScene->mRootNode->mParent = NULL;
    if (!DefaultLogger::isNullLogger()) {
        if ( nodes_in != nodes_out) {
            ASSIMP_LOG_INFO_F("OptimizeGraphProcess finished; Input nodes: ", nodes_in, ", Output nodes: ", nodes_out);
        } else {
            ASSIMP_LOG_DEBUG("OptimizeGraphProcess finished");
        }
    }
    meshes.clear();
    locked.clear();
}